

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstruct<float>::ContributeResidual
          (TPZDohrSubstruct<float> *this,TPZFMatrix<float> *u,TPZFMatrix<float> *r)

{
  float fVar1;
  int64_t iVar2;
  float *pfVar3;
  TPZMatrix<float> *row;
  pair<int,_int> *col;
  float *in_RDI;
  pair<int,_int> ind_1;
  pair<int,_int> ind;
  int neqs;
  int i;
  TPZFMatrix<float> reslocal;
  TPZFMatrix<float> ulocal;
  int64_t in_stack_fffffffffffffe50;
  int64_t in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  float in_stack_fffffffffffffe64;
  int64_t in_stack_fffffffffffffe70;
  int64_t in_stack_fffffffffffffe78;
  TPZFMatrix<float> *in_stack_fffffffffffffe80;
  int64_t in_stack_fffffffffffffe98;
  TPZFMatrix<float> *in_stack_fffffffffffffea0;
  int local_150;
  undefined1 local_140 [148];
  undefined4 local_ac;
  undefined1 local_a8 [168];
  
  local_ac = 0;
  TPZFMatrix<float>::TPZFMatrix(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,1,in_RDI);
  TPZFMatrix<float>::TPZFMatrix
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  iVar2 = TPZVec<std::pair<int,_int>_>::NElements((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x16c));
  for (local_150 = 0; local_150 < (int)iVar2; local_150 = local_150 + 1) {
    TPZVec<std::pair<int,_int>_>::operator[]
              ((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x16c),(long)local_150);
    pfVar3 = TPZFMatrix<float>::operator()
                       ((TPZFMatrix<float> *)
                        CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    in_stack_fffffffffffffe64 = *pfVar3;
    pfVar3 = TPZFMatrix<float>::operator()
                       ((TPZFMatrix<float> *)
                        CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    *pfVar3 = in_stack_fffffffffffffe64;
  }
  row = TPZAutoPointer<TPZMatrix<float>_>::operator->
                  ((TPZAutoPointer<TPZMatrix<float>_> *)(in_RDI + 0x13e));
  (*(row->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])
            (row,local_a8,in_RDI + 0x244,local_140);
  for (local_150 = 0; local_150 < (int)iVar2; local_150 = local_150 + 1) {
    col = TPZVec<std::pair<int,_int>_>::operator[]
                    ((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x16c),(long)local_150);
    pfVar3 = TPZFMatrix<float>::operator()
                       ((TPZFMatrix<float> *)
                        CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),(int64_t)row,
                        (int64_t)col);
    fVar1 = *pfVar3;
    pfVar3 = TPZFMatrix<float>::operator()
                       ((TPZFMatrix<float> *)
                        CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),(int64_t)row,
                        (int64_t)col);
    *pfVar3 = fVar1 + *pfVar3;
  }
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1fe6f8f);
  TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x1fe6f9c);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ContributeResidual(TPZFMatrix<TVar> &u, TPZFMatrix<TVar> &r){
	TPZFMatrix<TVar> ulocal(fNEquations,1,0.);
	TPZFMatrix<TVar> reslocal(fNEquations,1);
	int i;
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) 
	{
		std::pair<int,int> ind = fGlobalEqs[i];
		ulocal(ind.first,0) = u(ind.second,0);
	}
	fStiffness->Residual(ulocal, fLocalLoad, reslocal);
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		r(ind.second,0) += reslocal(ind.first,0);
	}
}